

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

int __thiscall
vkt::shaderexecutor::BuiltinPrecisionTests::init(BuiltinPrecisionTests *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *this_00;
  TestContext *pTVar1;
  int extraout_EAX;
  CaseFactories *pCVar2;
  value_type local_68 [4];
  undefined1 local_58 [8];
  MovePtr<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  completeCases;
  undefined1 local_38 [8];
  MovePtr<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  computeOnlyCases;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> shaderTypes;
  BuiltinPrecisionTests *this_local;
  
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::vector
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &computeOnlyCases.
              super_UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
              .m_data.field_0x8);
  createComputeOnlyBuiltinCases();
  createCompleteBuiltinCases();
  local_68[3] = 5;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &computeOnlyCases.
              super_UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
              .m_data.field_0x8,local_68 + 3);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  pCVar2 = de::details::
           UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
           ::operator*((UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
                        *)local_38);
  addBuiltinPrecisionTests
            (pTVar1,pCVar2,
             (vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &computeOnlyCases.
              super_UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
              .m_data.field_0x8,&this->super_TestCaseGroup);
  this_00 = &computeOnlyCases.
             super_UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
             .m_data.field_0x8;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::clear
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)this_00);
  local_68[2] = 0;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)this_00,local_68 + 2);
  local_68[1] = 1;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &computeOnlyCases.
              super_UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
              .m_data.field_0x8,local_68 + 1);
  local_68[0] = SHADERTYPE_COMPUTE;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &computeOnlyCases.
              super_UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
              .m_data.field_0x8,local_68);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  pCVar2 = de::details::
           UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
           ::operator*((UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
                        *)local_58);
  addBuiltinPrecisionTests
            (pTVar1,pCVar2,
             (vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &computeOnlyCases.
              super_UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
              .m_data.field_0x8,&this->super_TestCaseGroup);
  de::details::
  MovePtr<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  ::~MovePtr((MovePtr<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
              *)local_58);
  de::details::
  MovePtr<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  ::~MovePtr((MovePtr<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
              *)local_38);
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::~vector
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &computeOnlyCases.
              super_UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
              .m_data.field_0x8);
  return extraout_EAX;
}

Assistant:

void BuiltinPrecisionTests::init (void)
{
	std::vector<glu::ShaderType>		shaderTypes;
	de::MovePtr<const CaseFactories>	computeOnlyCases	= createComputeOnlyBuiltinCases();
	de::MovePtr<const CaseFactories>	completeCases		= createCompleteBuiltinCases();

	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	addBuiltinPrecisionTests(m_testCtx,
							 *computeOnlyCases,
							 shaderTypes,
							 *this);

	shaderTypes.clear();
	shaderTypes.push_back(glu::SHADERTYPE_VERTEX);
	shaderTypes.push_back(glu::SHADERTYPE_FRAGMENT);
	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	addBuiltinPrecisionTests(m_testCtx,
							 *completeCases,
							 shaderTypes,
							 *this);
}